

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator::GenerateBuilderMembers
          (ImmutableMessageFieldLiteGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  FieldDescriptor *pFVar2;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 aVar3;
  Options *pOVar4;
  undefined1 in_R8B;
  undefined1 uVar5;
  Semantic local_384;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_380;
  string_view local_378;
  string_view local_368;
  string_view local_358;
  FieldDescriptor local_348;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_2f0;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  string_view local_2d8;
  string_view local_2c8;
  FieldDescriptor local_2b8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_260;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  string_view local_248;
  string_view local_238;
  FieldDescriptor local_228;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1d0;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  FieldDescriptor local_198;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_140;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  string_view local_128;
  string_view local_118;
  FieldDescriptor local_108;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string_view local_98;
  string_view local_88 [2];
  FieldDescriptor local_68;
  Printer *printer_local;
  ImmutableMessageFieldLiteGenerator *this_local;
  
  pPVar1 = (Printer *)this->descriptor_;
  local_68.field_20 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27)printer;
  printer_local = (Printer *)this;
  pOVar4 = Context::options(this->context_);
  java::Options::Options((Options *)&local_68,pOVar4);
  WriteFieldDocComment((java *)printer,pPVar1,&local_68,(Options *)0x0,(bool)in_R8B);
  java::Options::~Options((Options *)&local_68);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,
             "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return instance.has$capitalized_name$();\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_88[0]);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_b0);
  end_varname_03._M_str = local_a8._M_str;
  end_varname_03._M_len = local_a8._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_98,end_varname_03,pFVar2,local_b0);
  aVar3 = local_68.field_20;
  uVar5 = SUB81(local_a8._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options((Options *)&local_108,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_108,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_108);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  return instance.get$capitalized_name$();\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_118);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_140);
  end_varname_02._M_str = local_138._M_str;
  end_varname_02._M_len = local_138._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_128,end_varname_02,pFVar2,local_140);
  aVar3 = local_68.field_20;
  uVar5 = SUB81(local_138._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options((Options *)&local_198,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_198,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_198);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,
             "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(value);\n  return this;\n  }\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_1a8);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"}");
  pFVar2 = this->descriptor_;
  local_228.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            (&local_1d0,(Semantic *)((long)&local_228.field_20 + 4));
  end_varname_01._M_str = local_1c8._M_str;
  end_varname_01._M_len = local_1c8._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_1b8,end_varname_01,pFVar2,local_1d0);
  aVar3 = local_68.field_20;
  uVar5 = SUB81(local_1c8._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options((Options *)&local_228,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_228,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_228);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_238,
             "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    $type$.Builder builderForValue) {\n  copyOnWrite();\n  instance.set$capitalized_name$(builderForValue.build());\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_238);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,"}");
  pFVar2 = this->descriptor_;
  local_2b8.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            (&local_260,(Semantic *)((long)&local_2b8.field_20 + 4));
  end_varname_00._M_str = local_258._M_str;
  end_varname_00._M_len = local_258._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_248,end_varname_00,pFVar2,local_260);
  aVar3 = local_68.field_20;
  uVar5 = SUB81(local_258._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options((Options *)&local_2b8,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_2b8,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_2b8);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2c8,
             "$deprecation$public Builder ${$merge$capitalized_name$$}$($type$ value) {\n  copyOnWrite();\n  instance.merge$capitalized_name$(value);\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_2c8);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8,"}");
  pFVar2 = this->descriptor_;
  local_348.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            (&local_2f0,(Semantic *)((long)&local_348.field_20 + 4));
  end_varname._M_str = local_2e8._M_str;
  end_varname._M_len = local_2e8._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_2d8,end_varname,pFVar2,local_2f0);
  aVar3 = local_68.field_20;
  uVar5 = SUB81(local_2e8._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options((Options *)&local_348,pOVar4);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_348,(Options *)0x0,(bool)uVar5);
  java::Options::~Options((Options *)&local_348);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_358,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$() {  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_358);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_368,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_378,"}");
  pFVar2 = this->descriptor_;
  local_384 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_380,&local_384);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_368,local_378,pFVar2,local_380);
  return;
}

Assistant:

void ImmutableMessageFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  // The comments above the methods below are based on a hypothetical
  // field of type "Field" called "Field".

  // boolean hasField()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return instance.has$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // Field getField()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  return instance.get$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$set$capitalized_name$$}$($type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(value);\n"
                 "  return this;\n"
                 "  }\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    $type$.Builder builderForValue) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(builderForValue.build());\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$merge$capitalized_name$$}$($type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.merge$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public Builder ${$clear$capitalized_name$$}$() {"
                 "  copyOnWrite();\n"
                 "  instance.clear$capitalized_name$();\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
}